

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int spng_encode_chunks(spng_ctx *ctx)

{
  spng__decode_plte *data_00;
  spng_splt *__s;
  uint8_t uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  spng_splt *psVar5;
  spng_text2 *psVar6;
  char *__s_00;
  uint8_t uVar7;
  uint8_t uVar8;
  int iVar9;
  spng_state sVar10;
  uint uVar11;
  void *__src;
  spng__decode_plte *psVar12;
  size_t sVar13;
  Bytef *pBVar14;
  size_t sVar15;
  uchar *puVar16;
  uint16_t uVar17;
  uint8_t *puVar18;
  size_t chunk_length;
  ulong uVar19;
  ulong uVar20;
  Bytef *__src_00;
  long lVar21;
  uchar *data;
  ulong uVar22;
  bool bVar23;
  uLongf dest_len;
  uchar *cdata;
  int local_94;
  uchar *local_90;
  bool local_81;
  ulong local_80;
  ulong local_78;
  size_t local_70;
  ulong local_68;
  size_t local_60;
  size_t local_58;
  uchar *local_50;
  z_stream *local_48;
  spng__zlib_options *local_40;
  uint8_t *local_38;
  
  if (ctx == (spng_ctx *)0x0) {
    return 1;
  }
  sVar10 = ctx->state;
  if (sVar10 == SPNG_STATE_INVALID) {
    return 0x46;
  }
  if (sVar10 == SPNG_STATE_INIT) {
    return 0x53;
  }
  if ((ctx->field_0xcc & 0x10) == 0) {
    return 0x51;
  }
  if (SPNG_STATE_IHDR < sVar10) {
    if (sVar10 == SPNG_STATE_FIRST_IDAT) {
      return 0;
    }
    if (sVar10 != SPNG_STATE_EOI) {
      return 0x54;
    }
    iVar9 = write_chunks_after_idat(ctx);
    if (iVar9 != 0) goto LAB_00106d7f;
    sVar10 = SPNG_STATE_IEND;
    goto LAB_00106d97;
  }
  if (((uint)ctx->stored & 1) == 0) {
    return 0xf;
  }
  iVar9 = write_data(ctx,spng_signature,8);
  if (iVar9 == 0) {
    data_00 = &ctx->decode_plte;
    uVar11 = (ctx->ihdr).width;
    uVar4 = (ctx->ihdr).height;
    (ctx->decode_plte).align_this =
         uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
    (ctx->decode_plte).rgba[1] =
         (spng_plte_entry)
         (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
    uVar1 = (ctx->ihdr).color_type;
    uVar7 = (ctx->ihdr).compression_method;
    uVar8 = (ctx->ihdr).filter_method;
    *(uint8_t *)((long)&ctx->decode_plte + 8) = (ctx->ihdr).bit_depth;
    *(uint8_t *)((long)&ctx->decode_plte + 9) = uVar1;
    *(uint8_t *)((long)&ctx->decode_plte + 10) = uVar7;
    *(uint8_t *)((long)&ctx->decode_plte + 0xb) = uVar8;
    (ctx->decode_plte).rgba[3].red = (ctx->ihdr).interlace_method;
    iVar9 = write_chunk(ctx,"IHDR",data_00,0xd);
    if (iVar9 == 0) {
      if (((uint)ctx->stored & 4) != 0) {
        uVar11 = (ctx->chrm_int).white_point_x;
        uVar4 = (ctx->chrm_int).white_point_y;
        (ctx->decode_plte).align_this =
             uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
        (ctx->decode_plte).rgba[1] =
             (spng_plte_entry)
             (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
        uVar11 = (ctx->chrm_int).red_x;
        (ctx->decode_plte).rgba[2] =
             (spng_plte_entry)
             (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18);
        uVar11 = (ctx->chrm_int).red_y;
        (ctx->decode_plte).rgba[3] =
             (spng_plte_entry)
             (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18);
        uVar11 = (ctx->chrm_int).green_x;
        (ctx->decode_plte).rgba[4] =
             (spng_plte_entry)
             (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18);
        uVar11 = (ctx->chrm_int).green_y;
        (ctx->decode_plte).rgba[5] =
             (spng_plte_entry)
             (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18);
        uVar11 = (ctx->chrm_int).blue_x;
        (ctx->decode_plte).rgba[6] =
             (spng_plte_entry)
             (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18);
        uVar11 = (ctx->chrm_int).blue_y;
        (ctx->decode_plte).rgba[7] =
             (spng_plte_entry)
             (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18);
        iVar9 = write_chunk(ctx,"cHRM",data_00,0x20);
        if (iVar9 != 0) goto switchD_00106f24_caseD_1;
      }
      if (((uint)ctx->stored & 0x10) != 0) {
        uVar11 = ctx->gama;
        (ctx->decode_plte).align_this =
             uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
        iVar9 = write_chunk(ctx,"gAMA",data_00,4);
        if (iVar9 != 0) goto switchD_00106f24_caseD_1;
      }
      if (((uint)ctx->stored & 8) != 0) {
        local_90 = (uchar *)compressBound((ctx->iccp).profile_len);
        __src = (*(ctx->alloc).malloc_fn)((size_t)local_90);
        if (__src == (void *)0x0) {
          local_94 = 2;
LAB_00106ee5:
          bVar23 = false;
        }
        else {
          iVar9 = compress2(__src,&local_90,(ctx->iccp).profile,(ctx->iccp).profile_len,0xffffffff);
          if (iVar9 != 0) {
            (*(ctx->alloc).free_fn)(__src);
            local_94 = 0x40;
            goto LAB_00106ee5;
          }
          sVar13 = strlen((ctx->iccp).profile_name);
          if (CARRY8(sVar13 + 2,(ulong)local_90)) {
            bVar23 = false;
            local_94 = 3;
          }
          else {
            local_50 = (uchar *)0x0;
            local_94 = write_header(ctx,"iCCP",(size_t)(local_90 + sVar13 + 2),&local_50);
            if (local_94 == 0) {
              memcpy(local_50,&ctx->iccp,sVar13 + 1);
              local_50[sVar13 + 1] = '\0';
              memcpy(local_50 + sVar13 + 2,__src,(size_t)local_90);
              (*(ctx->alloc).free_fn)(__src);
              local_94 = finish_chunk(ctx);
              bVar23 = local_94 == 0;
            }
            else {
              (*(ctx->alloc).free_fn)(__src);
              bVar23 = false;
            }
          }
        }
        iVar9 = local_94;
        if (!bVar23) goto switchD_00106f24_caseD_1;
      }
      if (((uint)ctx->stored & 0x20) != 0) {
        iVar9 = 0x50;
        switch((ctx->ihdr).color_type) {
        case '\0':
          (ctx->decode_plte).rgba[0].red = (ctx->sbit).grayscale_bits;
          sVar15 = 1;
          break;
        default:
          goto switchD_00106f24_caseD_1;
        case '\x02':
        case '\x03':
          (ctx->decode_plte).rgba[0].red = (ctx->sbit).red_bits;
          *(undefined2 *)((long)&ctx->decode_plte + 1) = *(undefined2 *)&(ctx->sbit).green_bits;
          sVar15 = 3;
          break;
        case '\x04':
          uVar1 = (ctx->sbit).alpha_bits;
          (ctx->decode_plte).rgba[0].red = (ctx->sbit).grayscale_bits;
          (ctx->decode_plte).rgba[0].green = uVar1;
          sVar15 = 2;
          break;
        case '\x06':
          uVar1 = (ctx->sbit).green_bits;
          uVar7 = (ctx->sbit).blue_bits;
          uVar8 = (ctx->sbit).alpha_bits;
          *(uint8_t *)&ctx->decode_plte = (ctx->sbit).red_bits;
          *(uint8_t *)((long)&ctx->decode_plte + 1) = uVar1;
          *(uint8_t *)((long)&ctx->decode_plte + 2) = uVar7;
          *(uint8_t *)((long)&ctx->decode_plte + 3) = uVar8;
          sVar15 = 4;
        }
        iVar9 = write_chunk(ctx,"sBIT",data_00,sVar15);
        if (iVar9 != 0) goto switchD_00106f24_caseD_1;
      }
      if (((((uint)ctx->stored & 0x40) == 0) ||
          (iVar9 = write_chunk(ctx,"sRGB",&ctx->srgb_rendering_intent,1), iVar9 == 0)) &&
         (iVar9 = write_unknown_chunks(ctx,SPNG_AFTER_IHDR), iVar9 == 0)) {
        if (((uint)ctx->stored & 2) != 0) {
          uVar11 = (ctx->plte).n_entries;
          if ((ulong)uVar11 != 0) {
            puVar18 = &(ctx->plte).entries[0].blue;
            uVar20 = 0;
            do {
              data_00->rgb[uVar20 & 0xffffffff] = ((spng_plte_entry *)(puVar18 + -2))->red;
              data_00->rgb[(int)uVar20 + 1] = puVar18[-1];
              data_00->rgb[(int)uVar20 + 2] = *puVar18;
              uVar20 = uVar20 + 3;
              puVar18 = puVar18 + 4;
            } while ((ulong)uVar11 * 3 != uVar20);
          }
          iVar9 = write_chunk(ctx,"PLTE",data_00,(ulong)(uVar11 * 3));
          if (iVar9 != 0) goto switchD_00106f24_caseD_1;
        }
        if (((ctx->stored).field_0x1 & 1) != 0) {
          iVar9 = 0x50;
          switch((ctx->ihdr).color_type) {
          case '\0':
          case '\x04':
            uVar17 = (ctx->bkgd).gray;
            (ctx->decode_plte).rgba[0].red = (uint8_t)(uVar17 >> 8);
            sVar15 = 2;
            psVar12 = (spng__decode_plte *)((long)&ctx->decode_plte + 1);
            break;
          default:
            goto switchD_00106f24_caseD_1;
          case '\x02':
          case '\x06':
            uVar2 = (ctx->bkgd).red;
            uVar3 = (ctx->bkgd).green;
            *(ushort *)&ctx->decode_plte = uVar2 << 8 | uVar2 >> 8;
            *(ushort *)((long)&ctx->decode_plte + 2) = uVar3 << 8 | uVar3 >> 8;
            uVar17 = (ctx->bkgd).blue;
            (ctx->decode_plte).rgba[1].red = (uint8_t)(uVar17 >> 8);
            sVar15 = 6;
            psVar12 = (spng__decode_plte *)((long)&ctx->decode_plte + 5);
            break;
          case '\x03':
            uVar17 = (ctx->bkgd).plte_index;
            sVar15 = 1;
            psVar12 = data_00;
          }
          psVar12->rgba[0].red = (uint8_t)uVar17;
          iVar9 = write_chunk(ctx,"bKGD",data_00,sVar15);
          if (iVar9 != 0) goto switchD_00106f24_caseD_1;
        }
        if (((ctx->stored).field_0x1 & 2) != 0) {
          uVar11 = (ctx->plte).n_entries;
          if ((ulong)uVar11 != 0) {
            uVar20 = 0;
            do {
              uVar2 = *(ushort *)((long)(ctx->hist).frequency + uVar20);
              *(ushort *)(ctx->trns_px + (uVar20 & 0xffffffff) + 8) = uVar2 << 8 | uVar2 >> 8;
              uVar20 = uVar20 + 2;
            } while ((ulong)uVar11 * 2 != uVar20);
          }
          iVar9 = write_chunk(ctx,"hIST",data_00,(ulong)(uVar11 * 2));
          if (iVar9 != 0) goto switchD_00106f24_caseD_1;
        }
        if (((ctx->stored).field_0x1 & 4) != 0) {
          uVar1 = (ctx->ihdr).color_type;
          if (uVar1 == '\x03') {
            sVar15 = (size_t)(ctx->trns).n_type3_entries;
            psVar12 = (spng__decode_plte *)(ctx->trns).type3_alpha;
LAB_001072bf:
            iVar9 = write_chunk(ctx,"tRNS",psVar12,sVar15);
          }
          else {
            psVar12 = data_00;
            if (uVar1 == '\x02') {
              uVar2 = (ctx->trns).red;
              uVar3 = (ctx->trns).green;
              *(ushort *)&ctx->decode_plte = uVar2 << 8 | uVar2 >> 8;
              *(ushort *)((long)&ctx->decode_plte + 2) = uVar3 << 8 | uVar3 >> 8;
              uVar2 = (ctx->trns).blue;
              *(ushort *)((long)&ctx->decode_plte + 4) = uVar2 << 8 | uVar2 >> 8;
              sVar15 = 6;
              goto LAB_001072bf;
            }
            iVar9 = 0;
            if (uVar1 == '\0') {
              uVar2 = (ctx->trns).gray;
              *(ushort *)&ctx->decode_plte = uVar2 << 8 | uVar2 >> 8;
              sVar15 = 2;
              goto LAB_001072bf;
            }
          }
          if (iVar9 != 0) goto switchD_00106f24_caseD_1;
        }
        if (((ctx->stored).field_0x1 & 8) != 0) {
          uVar11 = (ctx->phys).ppu_x;
          uVar4 = (ctx->phys).ppu_y;
          (ctx->decode_plte).align_this =
               uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
          (ctx->decode_plte).rgba[1] =
               (spng_plte_entry)
               (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
          (ctx->decode_plte).rgba[2].red = (ctx->phys).unit_specifier;
          iVar9 = write_chunk(ctx,"pHYs",data_00,9);
          if (iVar9 != 0) goto switchD_00106f24_caseD_1;
        }
        if (((ctx->stored).field_0x1 & 0x10) != 0) {
          local_90 = (uchar *)0x0;
          bVar23 = ctx->n_splt != 0;
          local_80 = CONCAT71(local_80._1_7_,bVar23);
          if (bVar23) {
            local_80 = CONCAT71(local_80._1_7_,1);
            uVar20 = 0;
            do {
              psVar5 = ctx->splt_list;
              __s = psVar5 + uVar20;
              local_68 = uVar20;
              local_70 = strlen(__s->name);
              sVar13 = local_70 + 1;
              uVar1 = psVar5[uVar20].sample_depth;
              if (uVar1 == '\b') {
                iVar9 = 6;
LAB_00107393:
                chunk_length = sVar13 + iVar9 * __s->n_entries + 1;
              }
              else {
                chunk_length = sVar13;
                if (uVar1 == '\x10') {
                  iVar9 = 10;
                  goto LAB_00107393;
                }
              }
              iVar9 = write_header(ctx,"sPLT",chunk_length,&local_90);
              if (iVar9 == 0) {
                memcpy(local_90,__s,sVar13);
                puVar16 = local_90 + local_70 + 2;
                local_90[local_70 + 1] = __s->sample_depth;
                if (__s->sample_depth == '\b') {
                  if (__s->n_entries != 0) {
                    uVar11 = 3;
                    lVar21 = 0;
                    uVar20 = 0;
                    do {
                      puVar16[uVar11 - 3] = *(uchar *)((long)&__s->entries->red + lVar21);
                      puVar16[uVar11 - 2] = *(uchar *)((long)&__s->entries->green + lVar21);
                      puVar16[uVar11 - 1] = *(uchar *)((long)&__s->entries->blue + lVar21);
                      puVar16[uVar11] = *(uchar *)((long)&__s->entries->alpha + lVar21);
                      uVar2 = *(ushort *)((long)&__s->entries->frequency + lVar21);
                      *(ushort *)(local_90 + (ulong)(uVar11 - 3) + local_70 + 6) =
                           uVar2 << 8 | uVar2 >> 8;
                      uVar20 = uVar20 + 1;
                      lVar21 = lVar21 + 10;
                      uVar11 = uVar11 + 6;
                    } while (uVar20 < __s->n_entries);
                  }
                }
                else if ((__s->sample_depth == '\x10') && (__s->n_entries != 0)) {
                  uVar20 = 0;
                  uVar22 = 0;
                  do {
                    uVar19 = uVar20 & 0xffffffff;
                    uVar2 = *(ushort *)((long)&__s->entries->red + uVar20);
                    *(ushort *)(puVar16 + uVar19) = uVar2 << 8 | uVar2 >> 8;
                    uVar2 = *(ushort *)((long)&__s->entries->green + uVar20);
                    *(ushort *)(local_90 + uVar19 + local_70 + 4) = uVar2 << 8 | uVar2 >> 8;
                    uVar2 = *(ushort *)((long)&__s->entries->blue + uVar20);
                    *(ushort *)(local_90 + uVar19 + local_70 + 6) = uVar2 << 8 | uVar2 >> 8;
                    uVar2 = *(ushort *)((long)&__s->entries->alpha + uVar20);
                    *(ushort *)(local_90 + uVar19 + local_70 + 8) = uVar2 << 8 | uVar2 >> 8;
                    uVar2 = *(ushort *)((long)&__s->entries->frequency + uVar20);
                    *(ushort *)(local_90 + uVar19 + local_70 + 10) = uVar2 << 8 | uVar2 >> 8;
                    uVar22 = uVar22 + 1;
                    uVar20 = uVar20 + 10;
                  } while (uVar22 < __s->n_entries);
                }
                local_90 = puVar16;
                iVar9 = finish_chunk(ctx);
                bVar23 = iVar9 == 0;
                if (!bVar23) {
                  local_94 = iVar9;
                }
              }
              else {
                bVar23 = false;
                local_94 = iVar9;
              }
              if (!bVar23) break;
              uVar20 = local_68 + 1;
              bVar23 = uVar20 < ctx->n_splt;
              local_80 = CONCAT71(local_80._1_7_,bVar23);
            } while (bVar23);
          }
          iVar9 = local_94;
          if ((local_80 & 1) != 0) goto switchD_00106f24_caseD_1;
        }
        if (((ctx->stored).field_0x1 & 0x20) != 0) {
          uVar2 = (ctx->time).year;
          *(ushort *)&ctx->decode_plte = uVar2 << 8 | uVar2 >> 8;
          (ctx->decode_plte).rgba[0].blue = (ctx->time).month;
          *(undefined4 *)((long)&ctx->decode_plte + 3) = *(undefined4 *)&(ctx->time).day;
          iVar9 = write_chunk(ctx,"tIME",data_00,7);
          if (iVar9 != 0) goto switchD_00106f24_caseD_1;
        }
        if (((uint)ctx->stored & 0x80) != 0) {
          local_90 = (uchar *)0x0;
          local_81 = ctx->n_text != 0;
          if (local_81) {
            local_40 = &ctx->text_options;
            local_48 = &ctx->zstream;
            local_81 = true;
            lVar21 = 0x30;
            local_68 = 0;
            do {
              psVar6 = ctx->text_list;
              iVar9 = *(int *)(psVar6->user_keyword_storage + lVar21 + -0x70);
              sVar13 = strlen(*(char **)(psVar6->user_keyword_storage + lVar21 + -0x68));
              local_70 = strlen(*(char **)(psVar6->user_keyword_storage + lVar21 + -0x60));
              local_80 = sVar13 + 1;
              local_38 = *(uint8_t **)(&DAT_0010fdd0 + (long)iVar9 * 8);
              if ((long)iVar9 == 3) {
                if ((*(char **)(psVar6->user_keyword_storage + lVar21 + -0x48) == (char *)0x0) ||
                   (__s_00 = *(char **)(psVar6->user_keyword_storage + lVar21 + -0x40),
                   __s_00 == (char *)0x0)) {
                  bVar23 = false;
                  local_94 = 0x50;
                }
                else {
                  local_58 = strlen(*(char **)(psVar6->user_keyword_storage + lVar21 + -0x48));
                  uVar20 = local_58 + local_80;
                  if (!CARRY8(local_58,local_80)) {
                    local_60 = strlen(__s_00);
                    uVar22 = uVar20 + local_60;
                    if (uVar22 < 0xfffffffffffffffc && !CARRY8(uVar20,local_60)) {
                      uVar22 = uVar22 + 4;
                      goto LAB_001076e8;
                    }
                  }
LAB_00107723:
                  bVar23 = false;
                  local_94 = 3;
                }
              }
              else {
                uVar22 = local_80;
                if (iVar9 == 2) {
                  uVar22 = sVar13 + 2;
                }
                local_58 = 0;
                local_60 = 0;
LAB_001076e8:
                if (psVar6->user_keyword_storage[lVar21 + -0x50] == '\0') {
                  pBVar14 = (Bytef *)0x0;
                  local_78 = 0;
                  bVar23 = CARRY8(uVar22,local_70);
                  uVar22 = uVar22 + local_70;
                  if (bVar23) goto LAB_00107723;
                }
                else {
                  iVar9 = spng__deflate_init(ctx,local_40);
                  if (iVar9 != 0) {
                    bVar23 = false;
                    local_94 = iVar9;
                    goto LAB_00107911;
                  }
                  local_78 = deflateBound(local_48,local_70);
                  pBVar14 = (Bytef *)(*(ctx->alloc).malloc_fn)(local_78);
                  if (pBVar14 == (Bytef *)0x0) {
                    local_94 = 2;
LAB_001077e3:
                    bVar23 = false;
                    local_78 = 0;
                  }
                  else {
                    (ctx->zstream).next_in =
                         *(Bytef **)(psVar6->user_keyword_storage + lVar21 + -0x60);
                    (ctx->zstream).avail_in = (uInt)local_70;
                    (ctx->zstream).next_out = pBVar14;
                    (ctx->zstream).avail_out = (uInt)local_78;
                    iVar9 = deflate(local_48,4);
                    if (iVar9 != 1) {
                      (*(ctx->alloc).free_fn)(pBVar14);
                      local_94 = 0x40;
                      goto LAB_001077e3;
                    }
                    local_78 = (ctx->zstream).total_out;
                    uVar22 = uVar22 + local_78;
                    bVar23 = local_78 <= uVar22;
                    if (!bVar23) {
                      local_94 = 3;
                    }
                  }
                  if (!bVar23) {
                    bVar23 = false;
                    goto LAB_00107911;
                  }
                }
                iVar9 = write_header(ctx,local_38,uVar22,&local_90);
                uVar20 = local_80;
                if (iVar9 == 0) {
                  memcpy(local_90,*(void **)(psVar6->user_keyword_storage + lVar21 + -0x68),local_80
                        );
                  local_90 = local_90 + uVar20;
                  if (*(int *)(psVar6->user_keyword_storage + lVar21 + -0x70) == 2) {
                    *local_90 = '\0';
                    local_90 = local_90 + 1;
                  }
                  else if (*(int *)(psVar6->user_keyword_storage + lVar21 + -0x70) == 3) {
                    *local_90 = psVar6->user_keyword_storage[lVar21 + -0x50];
                    local_90[1] = '\0';
                    local_90 = local_90 + 2;
                    sVar13 = local_58 + 1;
                    memcpy(local_90,*(void **)(psVar6->user_keyword_storage + lVar21 + -0x48),sVar13
                          );
                    local_90 = local_90 + sVar13;
                    sVar13 = local_60 + 1;
                    memcpy(local_90,*(void **)(psVar6->user_keyword_storage + lVar21 + -0x40),sVar13
                          );
                    local_90 = local_90 + sVar13;
                  }
                  uVar20 = local_78;
                  __src_00 = pBVar14;
                  if (psVar6->user_keyword_storage[lVar21 + -0x50] == '\0') {
                    uVar20 = local_70;
                    __src_00 = *(Bytef **)(psVar6->user_keyword_storage + lVar21 + -0x60);
                  }
                  memcpy(local_90,__src_00,uVar20);
                  (*(ctx->alloc).free_fn)(pBVar14);
                  iVar9 = finish_chunk(ctx);
                  bVar23 = iVar9 == 0;
                  if (!bVar23) {
                    local_94 = iVar9;
                  }
                }
                else {
                  (*(ctx->alloc).free_fn)(pBVar14);
                  bVar23 = false;
                  local_94 = iVar9;
                }
              }
LAB_00107911:
              if (!bVar23) break;
              local_68 = local_68 + 1;
              lVar21 = lVar21 + 0x90;
              local_81 = local_68 < ctx->n_text;
            } while (local_81);
          }
          iVar9 = local_94;
          if ((local_81 & 1U) != 0) goto switchD_00106f24_caseD_1;
        }
        if (((ctx->stored).field_0x1 & 0x40) != 0) {
          uVar11 = (ctx->offs).x;
          uVar4 = (ctx->offs).y;
          (ctx->decode_plte).align_this =
               uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
          (ctx->decode_plte).rgba[1] =
               (spng_plte_entry)
               (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
          (ctx->decode_plte).rgba[2].red = (ctx->offs).unit_specifier;
          iVar9 = write_chunk(ctx,"oFFs",data_00,9);
          if (iVar9 != 0) goto switchD_00106f24_caseD_1;
        }
        if ((((ctx->stored).field_0x1 & 0x80) == 0) ||
           (iVar9 = write_chunk(ctx,"eXIf",(ctx->exif).data,(ctx->exif).length), iVar9 == 0)) {
          iVar9 = write_unknown_chunks(ctx,SPNG_AFTER_PLTE);
        }
      }
    }
  }
switchD_00106f24_caseD_1:
  if (iVar9 != 0) {
LAB_00106d7f:
    ctx->state = SPNG_STATE_INVALID;
    return iVar9;
  }
  sVar10 = SPNG_STATE_FIRST_IDAT;
LAB_00106d97:
  ctx->state = sVar10;
  return 0;
}

Assistant:

int spng_encode_chunks(spng_ctx *ctx)
{
    if(ctx == NULL) return 1;
    if(!ctx->state) return SPNG_EBADSTATE;
    if(ctx->state < SPNG_STATE_OUTPUT) return SPNG_ENODST;
    if(!ctx->encode_only) return SPNG_ECTXTYPE;

    int ret = 0;

    if(ctx->state < SPNG_STATE_FIRST_IDAT)
    {
        if(!ctx->stored.ihdr) return SPNG_ENOIHDR;

        ret = write_chunks_before_idat(ctx);
        if(ret) return encode_err(ctx, ret);

        ctx->state = SPNG_STATE_FIRST_IDAT;
    }
    else if(ctx->state == SPNG_STATE_FIRST_IDAT)
    {
        return 0;
    }
    else if(ctx->state == SPNG_STATE_EOI)
    {
        ret = write_chunks_after_idat(ctx);
        if(ret) return encode_err(ctx, ret);

        ctx->state = SPNG_STATE_IEND;
    }
    else return SPNG_EOPSTATE;

    return 0;
}